

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreApp.cpp
# Opt level: O0

unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> __thiscall
helics::CoreApp::generateParser(CoreApp *this)

{
  bool bVar1;
  pointer phVar2;
  char *in_RSI;
  _Head_base<0UL,_helics::helicsCLI11App_*,_false> in_RDI;
  string *in_stack_00000018;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  string *in_stack_00000028;
  App *in_stack_00000030;
  helicsCLI11App *app_p;
  __single_object *app;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffff08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffff20;
  helicsCLI11App *this_00;
  anon_class_8_1_a7a570f2 local_a0 [4];
  pointer local_80;
  allocator<char> local_71 [9];
  char (*in_stack_ffffffffffffff98) [19];
  allocator<char> local_49 [56];
  undefined1 local_11;
  
  local_11 = 0;
  this_00 = in_RDI._M_head_impl;
  std::make_unique<helics::helicsCLI11App,char_const(&)[19]>(in_stack_ffffffffffffff98);
  CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
  operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
             0x46414f);
  helicsCLI11App::addTypeOption((helicsCLI11App *)app,this._7_1_);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x46416c);
  if (bVar1) {
    CLI::std::unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
    operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_> *)
               0x46417f);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,in_RSI,
               (allocator<char> *)in_RDI._M_head_impl);
    in_stack_ffffffffffffff20 =
         (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *)(in_RSI + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,in_RSI,
               (allocator<char> *)in_RDI._M_head_impl);
    CLI::App::
    add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
              (in_stack_00000030,in_stack_00000028,in_stack_00000020,in_stack_00000018);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_71);
    std::__cxx11::string::~string(in_stack_ffffffffffffff10);
    std::allocator<char>::~allocator(local_49);
  }
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x4642e2);
  CLI::App::allow_extras(&phVar2->super_App,true);
  local_80 = CLI::std::
             unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::get
                       ((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                         *)in_stack_ffffffffffffff10);
  phVar2 = CLI::std::
           unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>::
           operator->((unique_ptr<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>_>
                       *)0x46430a);
  std::function<std::__cxx11::string()>::function<helics::CoreApp::generateParser()::__0,void>
            (in_stack_ffffffffffffff20,local_a0);
  CLI::App::footer(&phVar2->super_App,in_stack_ffffffffffffff08);
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  ~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)0x464348);
  return (__uniq_ptr_data<helics::helicsCLI11App,_std::default_delete<helics::helicsCLI11App>,_true,_true>
          )(tuple<helics::helicsCLI11App_*,_std::default_delete<helics::helicsCLI11App>_>)
           in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<helicsCLI11App> CoreApp::generateParser()
{
    auto app = std::make_unique<helicsCLI11App>("Broker application");
    app->addTypeOption();
    if (name.empty()) {
        app->add_option("--name,-n", name, "name of the core");
    }
    app->allow_extras();
    auto* app_p = app.get();
    app->footer([app_p]() {
        auto coreType = helics::core::coreTypeFromString((*app_p)["--coretype"]->as<std::string>());
        CoreFactory::displayHelp(coreType);
        return std::string{};
    });
    return app;
}